

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNCall::gen_code_new
          (CTPNCall *this,int discard,int argc,int varargs,CTcNamedArgs *named_args,int from_call,
          int is_transient)

{
  uint uVar1;
  CTcPrsNode *pCVar2;
  CTPNArglistBase *this_00;
  uint in_ECX;
  uint in_ESI;
  CTPNCallBase *in_RDI;
  undefined1 *in_R8;
  int in_R9D;
  undefined4 in_stack_00000008;
  CTcNamedArgs my_named_args;
  int *in_stack_ffffffffffffffc8;
  CTPNArglist *in_stack_ffffffffffffffd0;
  undefined1 *local_20;
  
  if (in_R9D == 0) {
    local_20 = in_R8;
    if (in_R8 == (undefined1 *)0x0) {
      local_20 = &stack0xffffffffffffffc8;
    }
    CTPNCallBase::get_arg_list(in_RDI);
    CTPNArglist::gen_code_arglist
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(CTcNamedArgs *)in_RDI);
    pCVar2 = CTPNCallBase::get_func(in_RDI);
    this_00 = &CTPNCallBase::get_arg_list(in_RDI)->super_CTPNArglistBase;
    uVar1 = CTPNArglistBase::get_argc(this_00);
    (*(pCVar2->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x16])
              (pCVar2,(ulong)in_ESI,(ulong)uVar1,(ulong)in_ECX,local_20,1,in_stack_00000008);
  }
  else {
    CTcTokenizer::log_error(0x2cf8);
  }
  return;
}

Assistant:

void CTPNCall::gen_code_new(int discard, int argc, int varargs,
                            CTcNamedArgs *named_args,
                            int from_call, int is_transient)
{
    /* 
     *   if this is a recursive call from another 'call' node, it's not
     *   allowed - we'd be trying to use the result of a call as the base
     *   class of the 'new', which is illegal 
     */
    if (from_call)
    {
        G_tok->log_error(TCERR_INVAL_NEW_EXPR);
        return;
    }

    /* use our own named_args structure if the caller didn't provide one */
    CTcNamedArgs my_named_args;
    if (named_args == 0)
        named_args = &my_named_args;
    
    /* generate the argument list */
    get_arg_list()->gen_code_arglist(&varargs, *named_args);

    /* generate the code for the 'new' call */
    get_func()->gen_code_new(discard, get_arg_list()->get_argc(),
                             varargs, named_args, TRUE, is_transient);
}